

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

size_t ma_dr_wav__write_or_count_metadata
                 (ma_dr_wav *pWav,ma_dr_wav_metadata *pMetadatas,ma_uint32 metadataCount)

{
  ma_dr_wav_metadata_type mVar1;
  ma_uint32 mVar2;
  ma_uint32 mVar3;
  int iVar4;
  ma_uint64 mVar5;
  bool bVar6;
  bool bVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  uint uVar13;
  long lVar14;
  size_t sVar15;
  ma_uint32 *pmVar16;
  ulong uVar17;
  size_t sVar18;
  ma_uint8 *pmVar19;
  char *pcVar20;
  size_t sVar21;
  ulong uVar22;
  ulong uVar23;
  size_t sVar24;
  uint uVar25;
  size_t sVar26;
  char reservedBuf [180];
  size_t local_180;
  size_t local_170;
  size_t local_168;
  size_t local_160;
  uint local_118 [48];
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  sVar24 = 0;
  if (metadataCount != 0 && pMetadatas != (ma_dr_wav_metadata *)0x0) {
    bVar7 = false;
    uVar23 = (ulong)metadataCount;
    uVar22 = 0;
    sVar24 = 0;
    bVar6 = false;
    do {
      mVar1 = pMetadatas[uVar22].type;
      if (((mVar1 & ma_dr_wav_metadata_type_list_all_info_strings) != ma_dr_wav_metadata_type_none)
         || ((mVar1 == ma_dr_wav_metadata_type_unknown &&
             (pMetadatas[uVar22].data.smpl.productId == 2)))) {
        bVar6 = true;
      }
      if (((mVar1 & ma_dr_wav_metadata_type_list_all_adtl) != ma_dr_wav_metadata_type_none) ||
         ((mVar1 == ma_dr_wav_metadata_type_unknown && (pMetadatas[uVar22].data.smpl.productId == 3)
          ))) {
        bVar7 = true;
      }
      switch(mVar1) {
      case ma_dr_wav_metadata_type_unknown:
        if (pMetadatas[uVar22].data.smpl.productId != 1) goto switchD_001862c5_caseD_3;
        uVar13 = pMetadatas[uVar22].data.smpl.samplePeriodNanoseconds;
        sVar15 = 4;
        sVar8 = 4;
        if (pWav != (ma_dr_wav *)0x0) {
          sVar8 = (*pWav->onWrite)(pWav->pUserData,&pMetadatas[uVar22].data,4);
          local_118[0] = uVar13;
          sVar15 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
        }
        uVar17 = (ulong)pMetadatas[uVar22].data.smpl.samplePeriodNanoseconds;
        if (pWav != (ma_dr_wav *)0x0) {
          uVar17 = (*pWav->onWrite)(pWav->pUserData,
                                    pMetadatas[uVar22].data.bext.pOriginatorReference,uVar17);
        }
        sVar24 = sVar8 + sVar24 + sVar15 + uVar17;
        break;
      case ma_dr_wav_metadata_type_smpl:
        mVar2 = pMetadatas[uVar22].data.smpl.sampleLoopCount;
        mVar3 = pMetadatas[uVar22].data.smpl.samplerSpecificDataSizeInBytes;
        local_170 = 4;
        sVar8 = 4;
        if (pWav != (ma_dr_wav *)0x0) {
          sVar8 = (*pWav->onWrite)(pWav->pUserData,"smpl",4);
        }
        uVar13 = mVar3 + mVar2 * 0x18 + 0x24;
        if (pWav != (ma_dr_wav *)0x0) {
          local_118[0] = uVar13;
          local_170 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
        }
        sVar9 = 4;
        sVar15 = 4;
        if (pWav != (ma_dr_wav *)0x0) {
          local_118[0] = pMetadatas[uVar22].data.cue.cuePointCount;
          sVar15 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
          local_118[0] = pMetadatas[uVar22].data.smpl.productId;
          sVar9 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
        }
        local_160 = 4;
        sVar11 = 4;
        if (pWav != (ma_dr_wav *)0x0) {
          local_118[0] = pMetadatas[uVar22].data.smpl.samplePeriodNanoseconds;
          local_58 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
          local_118[0] = pMetadatas[uVar22].data.smpl.midiUnityNote;
          local_160 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
          sVar11 = local_58;
        }
        local_58 = sVar11;
        local_168 = 4;
        sVar11 = 4;
        if (pWav != (ma_dr_wav *)0x0) {
          local_118[0] = pMetadatas[uVar22].data.smpl.midiPitchFraction;
          sVar11 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
          local_118[0] = pMetadatas[uVar22].data.smpl.smpteFormat;
          local_168 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
        }
        sVar12 = 4;
        sVar18 = 4;
        if (pWav == (ma_dr_wav *)0x0) {
          sVar26 = 4;
        }
        else {
          local_118[0] = pMetadatas[uVar22].data.smpl.smpteOffset;
          sVar18 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
          local_118[0] = pMetadatas[uVar22].data.smpl.sampleLoopCount;
          sVar12 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
          local_118[0] = pMetadatas[uVar22].data.smpl.samplerSpecificDataSizeInBytes;
          sVar26 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
        }
        sVar24 = sVar8 + sVar24 + local_170 + sVar15 + sVar9 + local_58 + local_160 + sVar11 +
                 local_168 + sVar18 + sVar12 + sVar26;
        if (pMetadatas[uVar22].data.smpl.sampleLoopCount != 0) {
          lVar14 = 0;
          uVar17 = 0;
          do {
            local_170 = 4;
            sVar8 = 4;
            if (pWav != (ma_dr_wav *)0x0) {
              local_118[0] = *(uint *)((long)&(pMetadatas[uVar22].data.smpl.pLoops)->cuePointId +
                                      lVar14);
              sVar8 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
              local_118[0] = *(uint *)((long)&(pMetadatas[uVar22].data.smpl.pLoops)->type + lVar14);
              local_170 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
            }
            local_160 = 4;
            local_168 = 4;
            if (pWav != (ma_dr_wav *)0x0) {
              local_118[0] = *(uint *)((long)&(pMetadatas[uVar22].data.smpl.pLoops)->
                                              firstSampleByteOffset + lVar14);
              local_168 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
              local_118[0] = *(uint *)((long)&(pMetadatas[uVar22].data.smpl.pLoops)->
                                              lastSampleByteOffset + lVar14);
              local_160 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
            }
            sVar9 = 4;
            sVar15 = 4;
            if (pWav != (ma_dr_wav *)0x0) {
              local_118[0] = *(uint *)((long)&(pMetadatas[uVar22].data.smpl.pLoops)->sampleFraction
                                      + lVar14);
              sVar15 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
              local_118[0] = *(uint *)((long)&(pMetadatas[uVar22].data.smpl.pLoops)->playCount +
                                      lVar14);
              sVar9 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
            }
            sVar24 = sVar8 + sVar24 + local_170 + local_168 + local_160 + sVar15 + sVar9;
            uVar17 = uVar17 + 1;
            lVar14 = lVar14 + 0x18;
          } while (uVar17 < pMetadatas[uVar22].data.smpl.sampleLoopCount);
        }
        sVar8 = (size_t)pMetadatas[uVar22].data.smpl.samplerSpecificDataSizeInBytes;
        if (sVar8 != 0) {
          if (pWav != (ma_dr_wav *)0x0) {
            pmVar19 = pMetadatas[uVar22].data.smpl.pSamplerSpecificData;
LAB_0018718c:
            sVar8 = (*pWav->onWrite)(pWav->pUserData,pmVar19,sVar8);
          }
LAB_0018719e:
          sVar24 = sVar24 + sVar8;
        }
        break;
      case ma_dr_wav_metadata_type_smpl|ma_dr_wav_metadata_type_unknown:
      case ma_dr_wav_metadata_type_inst|ma_dr_wav_metadata_type_unknown:
      case ma_dr_wav_metadata_type_inst|ma_dr_wav_metadata_type_smpl:
      case ma_dr_wav_metadata_type_inst|ma_dr_wav_metadata_type_smpl|ma_dr_wav_metadata_type_unknown
      :
switchD_001862c5_caseD_3:
        uVar13 = 0;
        break;
      case ma_dr_wav_metadata_type_inst:
        sVar15 = 4;
        sVar8 = 4;
        if (pWav != (ma_dr_wav *)0x0) {
          sVar8 = (*pWav->onWrite)(pWav->pUserData,"inst",4);
        }
        if (pWav != (ma_dr_wav *)0x0) {
          local_118[0] = 7;
          sVar15 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
        }
        sVar11 = 1;
        sVar9 = 1;
        if (pWav != (ma_dr_wav *)0x0) {
          sVar9 = (*pWav->onWrite)(pWav->pUserData,&pMetadatas[uVar22].data,1);
          sVar11 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar22].data + 1),1);
        }
        sVar12 = 1;
        sVar18 = 1;
        if (pWav != (ma_dr_wav *)0x0) {
          sVar18 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar22].data + 2),1);
          sVar12 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar22].data + 3),1);
        }
        sVar21 = 1;
        sVar26 = 1;
        if (pWav == (ma_dr_wav *)0x0) {
          sVar10 = 1;
        }
        else {
          sVar26 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar22].data + 4),1);
          sVar21 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar22].data + 5),1);
          sVar10 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar22].data + 6),1);
        }
        sVar24 = sVar8 + sVar24 + sVar15 + sVar9 + sVar11 + sVar18 + sVar12 + sVar26 + sVar21 +
                 sVar10;
        uVar13 = 7;
        break;
      case ma_dr_wav_metadata_type_cue:
        mVar2 = pMetadatas[uVar22].data.cue.cuePointCount;
        sVar8 = 4;
        sVar15 = 4;
        if (pWav != (ma_dr_wav *)0x0) {
          sVar15 = (*pWav->onWrite)(pWav->pUserData,"cue ",4);
        }
        uVar13 = mVar2 * 0x18 + 4;
        if (pWav == (ma_dr_wav *)0x0) {
          sVar9 = 4;
        }
        else {
          local_118[0] = uVar13;
          sVar8 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
          local_118[0] = pMetadatas[uVar22].data.cue.cuePointCount;
          sVar9 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
        }
        sVar24 = sVar15 + sVar24 + sVar8 + sVar9;
        if (pMetadatas[uVar22].data.cue.cuePointCount != 0) {
          lVar14 = 0;
          uVar17 = 0;
          do {
            local_170 = 4;
            sVar8 = 4;
            if (pWav != (ma_dr_wav *)0x0) {
              local_118[0] = *(uint *)((pMetadatas[uVar22].data.cue.pCuePoints)->dataChunkId +
                                      lVar14 + -8);
              sVar8 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
              local_118[0] = *(uint *)((pMetadatas[uVar22].data.cue.pCuePoints)->dataChunkId +
                                      lVar14 + -4);
              local_170 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
            }
            local_160 = 4;
            local_168 = 4;
            if (pWav != (ma_dr_wav *)0x0) {
              local_168 = (*pWav->onWrite)(pWav->pUserData,
                                           (pMetadatas[uVar22].data.cue.pCuePoints)->dataChunkId +
                                           lVar14,4);
              local_118[0] = *(uint *)((pMetadatas[uVar22].data.cue.pCuePoints)->dataChunkId +
                                      lVar14 + 4);
              local_160 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
            }
            sVar9 = 4;
            sVar15 = 4;
            if (pWav != (ma_dr_wav *)0x0) {
              local_118[0] = *(uint *)((pMetadatas[uVar22].data.cue.pCuePoints)->dataChunkId +
                                      lVar14 + 8);
              sVar15 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
              local_118[0] = *(uint *)((pMetadatas[uVar22].data.cue.pCuePoints)->dataChunkId +
                                      lVar14 + 0xc);
              sVar9 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
            }
            sVar24 = sVar8 + sVar24 + local_170 + local_168 + local_160 + sVar15 + sVar9;
            uVar17 = uVar17 + 1;
            lVar14 = lVar14 + 0x18;
          } while (uVar17 < pMetadatas[uVar22].data.cue.cuePointCount);
        }
        break;
      default:
        if (mVar1 == ma_dr_wav_metadata_type_acid) {
          sVar8 = 4;
          sVar15 = 4;
          if (pWav != (ma_dr_wav *)0x0) {
            sVar15 = (*pWav->onWrite)(pWav->pUserData,"acid",4);
          }
          if (pWav == (ma_dr_wav *)0x0) {
            sVar9 = 4;
          }
          else {
            local_118[0] = 0x18;
            sVar8 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
            local_118[0] = pMetadatas[uVar22].data.cue.cuePointCount;
            sVar9 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
          }
          sVar18 = 2;
          sVar11 = 2;
          if (pWav != (ma_dr_wav *)0x0) {
            local_118[0]._0_2_ = pMetadatas[uVar22].data.acid.midiUnityNote;
            sVar11 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
            local_118[0] = CONCAT22(local_118[0]._2_2_,pMetadatas[uVar22].data.acid.reserved1);
            sVar18 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
          }
          local_170 = 4;
          sVar12 = 4;
          if (pWav != (ma_dr_wav *)0x0) {
            local_118[0] = pMetadatas[uVar22].data.smpl.samplePeriodNanoseconds;
            sVar12 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
            local_118[0] = pMetadatas[uVar22].data.smpl.midiUnityNote;
            local_170 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
          }
          sVar21 = 2;
          sVar26 = 2;
          if (pWav == (ma_dr_wav *)0x0) {
            sVar10 = 4;
          }
          else {
            local_118[0]._0_2_ = pMetadatas[uVar22].data.acid.meterDenominator;
            sVar26 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
            local_118[0] = CONCAT22(local_118[0]._2_2_,pMetadatas[uVar22].data.acid.meterNumerator);
            sVar21 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
            local_118[0] = pMetadatas[uVar22].data.smpl.smpteFormat;
            sVar10 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
          }
          sVar24 = sVar15 + sVar24 + sVar8 + sVar9 + sVar11 + sVar18 + sVar12 + local_170 + sVar26 +
                   sVar21 + sVar10;
          uVar13 = 0;
        }
        else {
          if (mVar1 != ma_dr_wav_metadata_type_bext) goto switchD_001862c5_caseD_3;
          uVar13 = pMetadatas[uVar22].data.bext.codingHistorySize + 0x25a;
          sVar15 = 4;
          sVar8 = 4;
          if (pWav != (ma_dr_wav *)0x0) {
            sVar8 = (*pWav->onWrite)(pWav->pUserData,"bext",4);
          }
          if (pWav != (ma_dr_wav *)0x0) {
            local_118[0] = uVar13;
            sVar15 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
          }
          ma_dr_wav__write_or_count_string_to_fixed_size_buf
                    (pWav,pMetadatas[uVar22].data.bext.pDescription,0x100);
          ma_dr_wav__write_or_count_string_to_fixed_size_buf
                    (pWav,pMetadatas[uVar22].data.bext.pOriginatorName,0x20);
          ma_dr_wav__write_or_count_string_to_fixed_size_buf
                    (pWav,pMetadatas[uVar22].data.bext.pOriginatorReference,0x20);
          if (pWav == (ma_dr_wav *)0x0) {
            sVar9 = 10;
            sVar11 = 8;
          }
          else {
            sVar9 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar22].data + 0x18)
                                     ,10);
            sVar11 = (*pWav->onWrite)(pWav->pUserData,
                                      (void *)((long)&pMetadatas[uVar22].data + 0x22),8);
          }
          mVar5 = pMetadatas[uVar22].data.bext.timeReference;
          sVar18 = 4;
          if (pWav == (ma_dr_wav *)0x0) {
            sVar12 = 2;
            local_48 = 0x40;
            local_38 = 4;
          }
          else {
            local_118[0] = (uint)mVar5;
            local_38 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
            local_118[0] = (uint)(mVar5 >> 0x20);
            sVar18 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
            local_118[0] = CONCAT22(local_118[0]._2_2_,pMetadatas[uVar22].data.bext.version);
            sVar12 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
            local_48 = (*pWav->onWrite)(pWav->pUserData,pMetadatas[uVar22].data.bext.pUMID,0x40);
          }
          local_170 = 2;
          sVar26 = 2;
          if (pWav != (ma_dr_wav *)0x0) {
            local_118[0]._0_2_ = pMetadatas[uVar22].data.bext.loudnessValue;
            local_40 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
            local_118[0] = CONCAT22(local_118[0]._2_2_,pMetadatas[uVar22].data.bext.loudnessRange);
            local_170 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
            sVar26 = local_40;
          }
          local_40 = sVar26;
          local_160 = 2;
          sVar26 = 2;
          if (pWav == (ma_dr_wav *)0x0) {
            local_50 = 2;
            local_58 = sVar18;
          }
          else {
            local_118[0]._0_2_ = pMetadatas[uVar22].data.bext.maxTruePeakLevel;
            sVar26 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
            local_118[0]._0_2_ = pMetadatas[uVar22].data.bext.maxMomentaryLoudness;
            local_160 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
            local_118[0] = CONCAT22(local_118[0]._2_2_,
                                    pMetadatas[uVar22].data.bext.maxShortTermLoudness);
            local_58 = sVar18;
            local_50 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
          }
          sVar18 = 0xb4;
          memset(local_118,0,0xb4);
          if (pWav != (ma_dr_wav *)0x0) {
            sVar18 = (*pWav->onWrite)(pWav->pUserData,local_118,0xb4);
          }
          sVar24 = sVar18 + sVar26 + local_160 + local_50 +
                            sVar12 + local_48 + local_40 + local_170 +
                            sVar11 + local_38 + local_58 + sVar15 + sVar9 + sVar24 + sVar8 + 0x140;
          sVar8 = (size_t)pMetadatas[uVar22].data.bext.codingHistorySize;
          if (sVar8 != 0) {
            if (pWav != (ma_dr_wav *)0x0) {
              pmVar19 = (ma_uint8 *)pMetadatas[uVar22].data.bext.pCodingHistory;
              goto LAB_0018718c;
            }
            goto LAB_0018719e;
          }
        }
      }
      if ((uVar13 & 1) != 0) {
        if (pWav == (ma_dr_wav *)0x0) {
          sVar8 = 1;
        }
        else {
          local_118[0] = local_118[0] & 0xffffff00;
          sVar8 = (*pWav->onWrite)(pWav->pUserData,local_118,1);
        }
        sVar24 = sVar24 + sVar8;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar23);
    if (bVar6) {
      if (metadataCount == 0) {
        uVar13 = 4;
      }
      else {
        uVar13 = 4;
        lVar14 = 0;
        do {
          uVar25 = *(uint *)((long)&pMetadatas->type + lVar14);
          if ((uVar25 & 0x3fe00) == 0) {
            if ((uVar25 == 1) && (*(int *)((long)&pMetadatas->data + lVar14 + 4) == 2)) {
              uVar13 = uVar13 + *(int *)((long)&pMetadatas->data + lVar14 + 8) + 8;
            }
          }
          else {
            uVar13 = uVar13 + *(int *)((long)&pMetadatas->data + lVar14) + 9;
          }
          uVar13 = uVar13 + (uVar13 & 1);
          lVar14 = lVar14 + 0x70;
        } while (uVar23 * 0x70 - lVar14 != 0);
      }
      sVar15 = 4;
      sVar8 = 4;
      if (pWav != (ma_dr_wav *)0x0) {
        sVar8 = (*pWav->onWrite)(pWav->pUserData,"LIST",4);
      }
      if (pWav != (ma_dr_wav *)0x0) {
        local_118[0] = uVar13;
        sVar15 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
      }
      if (pWav == (ma_dr_wav *)0x0) {
        sVar9 = 4;
      }
      else {
        sVar9 = (*pWav->onWrite)(pWav->pUserData,"INFO",4);
      }
      sVar24 = sVar8 + sVar24 + sVar15 + sVar9;
      if (metadataCount != 0) {
        lVar14 = 0;
        do {
          uVar13 = *(uint *)((long)&pMetadatas->type + lVar14);
          if ((uVar13 & 0x3fe00) == 0) {
            uVar25 = 0;
            if ((uVar13 == 1) && (uVar25 = 0, *(int *)((long)&pMetadatas->data + lVar14 + 4) == 2))
            {
              uVar13 = *(uint *)((long)&pMetadatas->data + lVar14 + 8);
              sVar8 = (size_t)uVar13;
              if (sVar8 != 0) {
                sVar9 = 4;
                sVar15 = 4;
                if (pWav != (ma_dr_wav *)0x0) {
                  sVar15 = (*pWav->onWrite)(pWav->pUserData,
                                            (void *)((long)&pMetadatas->data + lVar14),4);
                  local_118[0] = *(uint *)((long)&pMetadatas->data + lVar14 + 8);
                  sVar9 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
                  sVar8 = (*pWav->onWrite)(pWav->pUserData,
                                           *(void **)((long)&pMetadatas->data + lVar14 + 0x10),sVar8
                                          );
                }
                sVar24 = sVar15 + sVar24 + sVar9 + sVar8;
                uVar25 = uVar13;
              }
            }
          }
          else {
            if ((int)uVar13 < 0x2000) {
              if ((int)uVar13 < 0x800) {
                if (uVar13 == 0x200) {
                  pcVar20 = "ISFT";
                }
                else {
                  pcVar20 = (char *)0x0;
                  if (uVar13 == 0x400) {
                    pcVar20 = "ICOP";
                  }
                }
              }
              else if (uVar13 == 0x800) {
                pcVar20 = "INAM";
              }
              else {
                pcVar20 = (char *)0x0;
                if (uVar13 == 0x1000) {
                  pcVar20 = "IART";
                }
              }
            }
            else if ((int)uVar13 < 0x8000) {
              if (uVar13 == 0x2000) {
                pcVar20 = "ICMT";
              }
              else {
                pcVar20 = (char *)0x0;
                if (uVar13 == 0x4000) {
                  pcVar20 = "ICRD";
                }
              }
            }
            else if (uVar13 == 0x8000) {
              pcVar20 = "IGNR";
            }
            else if (uVar13 == 0x10000) {
              pcVar20 = "IPRD";
            }
            else {
              pcVar20 = (char *)0x0;
              if (uVar13 == 0x20000) {
                pcVar20 = "ITRK";
              }
            }
            iVar4 = *(int *)((long)&pMetadatas->data + lVar14);
            if (iVar4 == 0) {
              uVar25 = 0;
            }
            else {
              sVar15 = 4;
              sVar8 = 4;
              if (pWav != (ma_dr_wav *)0x0) {
                sVar8 = (*pWav->onWrite)(pWav->pUserData,pcVar20,4);
              }
              uVar25 = iVar4 + 1;
              if (pWav != (ma_dr_wav *)0x0) {
                local_118[0] = uVar25;
                sVar15 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
              }
              sVar9 = (size_t)*(uint *)((long)&pMetadatas->data + lVar14);
              if (pWav == (ma_dr_wav *)0x0) {
                sVar11 = 1;
              }
              else {
                sVar9 = (*pWav->onWrite)(pWav->pUserData,
                                         *(void **)((long)&pMetadatas->data + lVar14 + 8),sVar9);
                local_118[0] = local_118[0] & 0xffffff00;
                sVar11 = (*pWav->onWrite)(pWav->pUserData,local_118,1);
              }
              sVar24 = sVar8 + sVar24 + sVar15 + sVar9 + sVar11;
            }
          }
          if ((uVar25 & 1) != 0) {
            if (pWav == (ma_dr_wav *)0x0) {
              sVar8 = 1;
            }
            else {
              local_118[0] = local_118[0] & 0xffffff00;
              sVar8 = (*pWav->onWrite)(pWav->pUserData,local_118,1);
            }
            sVar24 = sVar24 + sVar8;
          }
          lVar14 = lVar14 + 0x70;
        } while (uVar23 * 0x70 != lVar14);
      }
    }
    if (bVar7) {
      if (metadataCount == 0) {
        uVar13 = 4;
      }
      else {
        uVar13 = 4;
        lVar14 = 0;
        do {
          iVar4 = *(int *)((long)&pMetadatas->type + lVar14);
          if (iVar4 < 0x80) {
            if (iVar4 == 1) {
              if (*(int *)((long)&pMetadatas->data + lVar14 + 4) == 3) {
                uVar13 = uVar13 + *(int *)((long)&pMetadatas->data + lVar14 + 8) + 8;
              }
            }
            else if (iVar4 == 0x40) {
LAB_00187612:
              iVar4 = *(int *)((long)&pMetadatas->data + lVar14 + 4);
              if (iVar4 == 0) {
                uVar13 = uVar13 + 0xc;
              }
              else {
                uVar13 = uVar13 + iVar4 + 0xd;
              }
            }
          }
          else if (iVar4 == 0x100) {
            iVar4 = *(int *)((long)&pMetadatas->data + lVar14 + 0x14);
            if (iVar4 == 0) {
              uVar13 = uVar13 + 0x1c;
            }
            else {
              uVar13 = uVar13 + iVar4 + 0x1d;
            }
          }
          else if (iVar4 == 0x80) goto LAB_00187612;
          uVar13 = uVar13 + (uVar13 & 1);
          lVar14 = lVar14 + 0x70;
        } while (uVar23 * 0x70 - lVar14 != 0);
      }
      sVar15 = 4;
      sVar8 = 4;
      if (pWav != (ma_dr_wav *)0x0) {
        sVar8 = (*pWav->onWrite)(pWav->pUserData,"LIST",4);
      }
      if (pWav != (ma_dr_wav *)0x0) {
        local_118[0] = uVar13;
        sVar15 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
      }
      if (pWav == (ma_dr_wav *)0x0) {
        sVar9 = 4;
      }
      else {
        sVar9 = (*pWav->onWrite)(pWav->pUserData,"adtl",4);
      }
      sVar24 = sVar8 + sVar24 + sVar15 + sVar9;
      if (metadataCount != 0) {
        pmVar16 = &(pMetadatas->data).smpl.samplePeriodNanoseconds;
        do {
          uVar13 = pmVar16[-4];
          if ((int)uVar13 < 0x80) {
            if (uVar13 == 1) {
              if (pmVar16[-1] == 3) {
                uVar13 = *pmVar16;
                uVar22 = (ulong)uVar13;
                sVar15 = 4;
                sVar8 = 4;
                sVar9 = uVar22;
                if (pWav != (ma_dr_wav *)0x0) {
                  sVar8 = (*pWav->onWrite)(pWav->pUserData,(ma_dr_wav_smpl *)(pmVar16 + -2),4);
                  local_118[0] = uVar13;
                  sVar15 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
                  sVar9 = (*pWav->onWrite)(pWav->pUserData,*(void **)(pmVar16 + 2),uVar22);
                }
                sVar24 = sVar8 + sVar24 + sVar15 + sVar9;
                goto LAB_00187b7a;
              }
            }
            else if (uVar13 == 0x40) {
LAB_0018773d:
              if (pmVar16[-1] != 0) {
                sVar8 = 4;
                sVar15 = 4;
                if (pWav != (ma_dr_wav *)0x0) {
                  pcVar20 = (char *)0x0;
                  if (uVar13 == 0x80) {
                    pcVar20 = "note";
                  }
                  if (uVar13 == 0x40) {
                    pcVar20 = "labl";
                  }
                  sVar15 = (*pWav->onWrite)(pWav->pUserData,pcVar20,4);
                }
                uVar22 = (ulong)(pmVar16[-1] + 5);
                if (pWav == (ma_dr_wav *)0x0) {
                  sVar9 = 4;
                }
                else {
                  local_118[0] = pmVar16[-1] + 5;
                  sVar8 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
                  local_118[0] = ((ma_dr_wav_smpl *)(pmVar16 + -2))->manufacturerId;
                  sVar9 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
                }
                sVar11 = (size_t)pmVar16[-1];
                if (pWav == (ma_dr_wav *)0x0) {
                  sVar18 = 1;
                }
                else {
                  sVar11 = (*pWav->onWrite)(pWav->pUserData,*(void **)pmVar16,sVar11);
                  local_118[0] = local_118[0] & 0xffffff00;
                  sVar18 = (*pWav->onWrite)(pWav->pUserData,local_118,1);
                }
                sVar24 = sVar15 + sVar24 + sVar8 + sVar9 + sVar11 + sVar18;
                goto LAB_00187b7a;
              }
            }
LAB_00187886:
            uVar22 = 0;
          }
          else {
            if (uVar13 != 0x100) {
              if (uVar13 == 0x80) goto LAB_0018773d;
              goto LAB_00187886;
            }
            sVar15 = 4;
            sVar8 = 4;
            if (pWav != (ma_dr_wav *)0x0) {
              sVar8 = (*pWav->onWrite)(pWav->pUserData,"ltxt",4);
            }
            uVar22 = (ulong)(pmVar16[3] + 0x15);
            if (pmVar16[3] == 0) {
              uVar22 = 0x14;
            }
            if (pWav != (ma_dr_wav *)0x0) {
              local_118[0] = (uint)uVar22;
              sVar15 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
            }
            sVar9 = 4;
            local_180 = 4;
            if (pWav == (ma_dr_wav *)0x0) {
              sVar11 = 4;
            }
            else {
              local_118[0] = ((ma_dr_wav_smpl *)(pmVar16 + -2))->manufacturerId;
              sVar9 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
              local_118[0] = pmVar16[-1];
              local_180 = (*pWav->onWrite)(pWav->pUserData,local_118,4);
              sVar11 = (*pWav->onWrite)(pWav->pUserData,pmVar16,4);
            }
            local_170 = 2;
            sVar18 = 2;
            if (pWav != (ma_dr_wav *)0x0) {
              local_118[0]._0_2_ = (short)pmVar16[1];
              sVar18 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
              local_118[0] = CONCAT22(local_118[0]._2_2_,*(undefined2 *)((long)pmVar16 + 6));
              local_170 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
            }
            sVar26 = 2;
            sVar12 = 2;
            if (pWav != (ma_dr_wav *)0x0) {
              local_118[0]._0_2_ = (short)pmVar16[2];
              sVar12 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
              local_118[0] = CONCAT22(local_118[0]._2_2_,*(undefined2 *)((long)pmVar16 + 10));
              sVar26 = (*pWav->onWrite)(pWav->pUserData,local_118,2);
            }
            sVar24 = sVar8 + sVar24 + sVar15 + sVar9 + local_180 + sVar11 + sVar18 + local_170 +
                     sVar12 + sVar26;
            sVar8 = (size_t)pmVar16[3];
            if (sVar8 != 0) {
              if (pWav == (ma_dr_wav *)0x0) {
                sVar15 = 1;
              }
              else {
                sVar8 = (*pWav->onWrite)(pWav->pUserData,*(void **)(pmVar16 + 4),sVar8);
                local_118[0] = local_118[0] & 0xffffff00;
                sVar15 = (*pWav->onWrite)(pWav->pUserData,local_118,1);
              }
              sVar24 = sVar8 + sVar24 + sVar15;
            }
          }
LAB_00187b7a:
          if ((uVar22 & 1) != 0) {
            if (pWav == (ma_dr_wav *)0x0) {
              sVar8 = 1;
            }
            else {
              local_118[0] = local_118[0] & 0xffffff00;
              sVar8 = (*pWav->onWrite)(pWav->pUserData,local_118,1);
            }
            sVar24 = sVar24 + sVar8;
          }
          pmVar16 = pmVar16 + 0x1c;
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
      }
    }
  }
  return sVar24;
}

Assistant:

MA_PRIVATE size_t ma_dr_wav__write_or_count_metadata(ma_dr_wav* pWav, ma_dr_wav_metadata* pMetadatas, ma_uint32 metadataCount)
{
    size_t bytesWritten = 0;
    ma_bool32 hasListAdtl = MA_FALSE;
    ma_bool32 hasListInfo = MA_FALSE;
    ma_uint32 iMetadata;
    if (pMetadatas == NULL || metadataCount == 0) {
        return 0;
    }
    for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
        ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
        ma_uint32 chunkSize = 0;
        if ((pMetadata->type & ma_dr_wav_metadata_type_list_all_info_strings) || (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_info_list)) {
            hasListInfo = MA_TRUE;
        }
        if ((pMetadata->type & ma_dr_wav_metadata_type_list_all_adtl) || (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_adtl_list)) {
            hasListAdtl = MA_TRUE;
        }
        switch (pMetadata->type) {
            case ma_dr_wav_metadata_type_smpl:
            {
                ma_uint32 iLoop;
                chunkSize = MA_DR_WAV_SMPL_BYTES + MA_DR_WAV_SMPL_LOOP_BYTES * pMetadata->data.smpl.sampleLoopCount + pMetadata->data.smpl.samplerSpecificDataSizeInBytes;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "smpl", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.manufacturerId);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.productId);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.samplePeriodNanoseconds);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.midiUnityNote);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.midiPitchFraction);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.smpteFormat);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.smpteOffset);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.sampleLoopCount);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.samplerSpecificDataSizeInBytes);
                for (iLoop = 0; iLoop < pMetadata->data.smpl.sampleLoopCount; ++iLoop) {
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].cuePointId);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].type);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].firstSampleByteOffset);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].lastSampleByteOffset);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].sampleFraction);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].playCount);
                }
                if (pMetadata->data.smpl.samplerSpecificDataSizeInBytes > 0) {
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.smpl.pSamplerSpecificData, pMetadata->data.smpl.samplerSpecificDataSizeInBytes);
                }
            } break;
            case ma_dr_wav_metadata_type_inst:
            {
                chunkSize = MA_DR_WAV_INST_BYTES;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "inst", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.midiUnityNote, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.fineTuneCents, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.gainDecibels, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.lowNote, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.highNote, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.lowVelocity, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.highVelocity, 1);
            } break;
            case ma_dr_wav_metadata_type_cue:
            {
                ma_uint32 iCuePoint;
                chunkSize = MA_DR_WAV_CUE_BYTES + MA_DR_WAV_CUE_POINT_BYTES * pMetadata->data.cue.cuePointCount;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "cue ", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.cuePointCount);
                for (iCuePoint = 0; iCuePoint < pMetadata->data.cue.cuePointCount; ++iCuePoint) {
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].id);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].playOrderPosition);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].dataChunkId, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].chunkStart);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].blockStart);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].sampleByteOffset);
                }
            } break;
            case ma_dr_wav_metadata_type_acid:
            {
                chunkSize = MA_DR_WAV_ACID_BYTES;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "acid", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.acid.flags);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.midiUnityNote);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.reserved1);
                bytesWritten += ma_dr_wav__write_or_count_f32ne_to_le(pWav, pMetadata->data.acid.reserved2);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.acid.numBeats);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.meterDenominator);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.meterNumerator);
                bytesWritten += ma_dr_wav__write_or_count_f32ne_to_le(pWav, pMetadata->data.acid.tempo);
            } break;
            case ma_dr_wav_metadata_type_bext:
            {
                char reservedBuf[MA_DR_WAV_BEXT_RESERVED_BYTES];
                ma_uint32 timeReferenceLow;
                ma_uint32 timeReferenceHigh;
                chunkSize = MA_DR_WAV_BEXT_BYTES + pMetadata->data.bext.codingHistorySize;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "bext", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_string_to_fixed_size_buf(pWav, pMetadata->data.bext.pDescription, MA_DR_WAV_BEXT_DESCRIPTION_BYTES);
                bytesWritten += ma_dr_wav__write_or_count_string_to_fixed_size_buf(pWav, pMetadata->data.bext.pOriginatorName, MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES);
                bytesWritten += ma_dr_wav__write_or_count_string_to_fixed_size_buf(pWav, pMetadata->data.bext.pOriginatorReference, MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES);
                bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pOriginationDate, sizeof(pMetadata->data.bext.pOriginationDate));
                bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pOriginationTime, sizeof(pMetadata->data.bext.pOriginationTime));
                timeReferenceLow  = (ma_uint32)(pMetadata->data.bext.timeReference & 0xFFFFFFFF);
                timeReferenceHigh = (ma_uint32)(pMetadata->data.bext.timeReference >> 32);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, timeReferenceLow);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, timeReferenceHigh);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.version);
                bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pUMID, MA_DR_WAV_BEXT_UMID_BYTES);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.loudnessValue);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.loudnessRange);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.maxTruePeakLevel);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.maxMomentaryLoudness);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.maxShortTermLoudness);
                MA_DR_WAV_ZERO_MEMORY(reservedBuf, sizeof(reservedBuf));
                bytesWritten += ma_dr_wav__write_or_count(pWav, reservedBuf, sizeof(reservedBuf));
                if (pMetadata->data.bext.codingHistorySize > 0) {
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pCodingHistory, pMetadata->data.bext.codingHistorySize);
                }
            } break;
            case ma_dr_wav_metadata_type_unknown:
            {
                if (pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_top_level) {
                    chunkSize = pMetadata->data.unknown.dataSizeInBytes;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.id, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.pData, pMetadata->data.unknown.dataSizeInBytes);
                }
            } break;
            default: break;
        }
        if ((chunkSize % 2) != 0) {
            bytesWritten += ma_dr_wav__write_or_count_byte(pWav, 0);
        }
    }
    if (hasListInfo) {
        ma_uint32 chunkSize = 4;
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            if ((pMetadata->type & ma_dr_wav_metadata_type_list_all_info_strings)) {
                chunkSize += 8;
                chunkSize += pMetadata->data.infoText.stringLength + 1;
            } else if (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_info_list) {
                chunkSize += 8;
                chunkSize += pMetadata->data.unknown.dataSizeInBytes;
            }
            if ((chunkSize % 2) != 0) {
                chunkSize += 1;
            }
        }
        bytesWritten += ma_dr_wav__write_or_count(pWav, "LIST", 4);
        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
        bytesWritten += ma_dr_wav__write_or_count(pWav, "INFO", 4);
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            ma_uint32 subchunkSize = 0;
            if (pMetadata->type & ma_dr_wav_metadata_type_list_all_info_strings) {
                const char* pID = NULL;
                switch (pMetadata->type) {
                    case ma_dr_wav_metadata_type_list_info_software:    pID = "ISFT"; break;
                    case ma_dr_wav_metadata_type_list_info_copyright:   pID = "ICOP"; break;
                    case ma_dr_wav_metadata_type_list_info_title:       pID = "INAM"; break;
                    case ma_dr_wav_metadata_type_list_info_artist:      pID = "IART"; break;
                    case ma_dr_wav_metadata_type_list_info_comment:     pID = "ICMT"; break;
                    case ma_dr_wav_metadata_type_list_info_date:        pID = "ICRD"; break;
                    case ma_dr_wav_metadata_type_list_info_genre:       pID = "IGNR"; break;
                    case ma_dr_wav_metadata_type_list_info_album:       pID = "IPRD"; break;
                    case ma_dr_wav_metadata_type_list_info_tracknumber: pID = "ITRK"; break;
                    default: break;
                }
                MA_DR_WAV_ASSERT(pID != NULL);
                if (pMetadata->data.infoText.stringLength) {
                    subchunkSize = pMetadata->data.infoText.stringLength + 1;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pID, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.infoText.pString, pMetadata->data.infoText.stringLength);
                    bytesWritten += ma_dr_wav__write_or_count_byte(pWav, '\0');
                }
            } else if (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_info_list) {
                if (pMetadata->data.unknown.dataSizeInBytes) {
                    subchunkSize = pMetadata->data.unknown.dataSizeInBytes;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.id, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.unknown.dataSizeInBytes);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.pData, subchunkSize);
                }
            }
            if ((subchunkSize % 2) != 0) {
                bytesWritten += ma_dr_wav__write_or_count_byte(pWav, 0);
            }
        }
    }
    if (hasListAdtl) {
        ma_uint32 chunkSize = 4;
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            switch (pMetadata->type)
            {
                case ma_dr_wav_metadata_type_list_label:
                case ma_dr_wav_metadata_type_list_note:
                {
                    chunkSize += 8;
                    chunkSize += MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
                    if (pMetadata->data.labelOrNote.stringLength > 0) {
                        chunkSize += pMetadata->data.labelOrNote.stringLength + 1;
                    }
                } break;
                case ma_dr_wav_metadata_type_list_labelled_cue_region:
                {
                    chunkSize += 8;
                    chunkSize += MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
                    if (pMetadata->data.labelledCueRegion.stringLength > 0) {
                        chunkSize += pMetadata->data.labelledCueRegion.stringLength + 1;
                    }
                } break;
                case ma_dr_wav_metadata_type_unknown:
                {
                    if (pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_adtl_list) {
                        chunkSize += 8;
                        chunkSize += pMetadata->data.unknown.dataSizeInBytes;
                    }
                } break;
                default: break;
            }
            if ((chunkSize % 2) != 0) {
                chunkSize += 1;
            }
        }
        bytesWritten += ma_dr_wav__write_or_count(pWav, "LIST", 4);
        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
        bytesWritten += ma_dr_wav__write_or_count(pWav, "adtl", 4);
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            ma_uint32 subchunkSize = 0;
            switch (pMetadata->type)
            {
                case ma_dr_wav_metadata_type_list_label:
                case ma_dr_wav_metadata_type_list_note:
                {
                    if (pMetadata->data.labelOrNote.stringLength > 0) {
                        const char *pID = NULL;
                        if (pMetadata->type == ma_dr_wav_metadata_type_list_label) {
                            pID = "labl";
                        }
                        else if (pMetadata->type == ma_dr_wav_metadata_type_list_note) {
                            pID = "note";
                        }
                        MA_DR_WAV_ASSERT(pID != NULL);
                        MA_DR_WAV_ASSERT(pMetadata->data.labelOrNote.pString != NULL);
                        subchunkSize = MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pID, 4);
                        subchunkSize += pMetadata->data.labelOrNote.stringLength + 1;
                        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.labelOrNote.cuePointId);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.labelOrNote.pString, pMetadata->data.labelOrNote.stringLength);
                        bytesWritten += ma_dr_wav__write_or_count_byte(pWav, '\0');
                    }
                } break;
                case ma_dr_wav_metadata_type_list_labelled_cue_region:
                {
                    subchunkSize = MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, "ltxt", 4);
                    if (pMetadata->data.labelledCueRegion.stringLength > 0) {
                        subchunkSize += pMetadata->data.labelledCueRegion.stringLength + 1;
                    }
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.labelledCueRegion.cuePointId);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.labelledCueRegion.sampleLength);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.labelledCueRegion.purposeId, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.country);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.language);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.dialect);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.codePage);
                    if (pMetadata->data.labelledCueRegion.stringLength > 0) {
                        MA_DR_WAV_ASSERT(pMetadata->data.labelledCueRegion.pString != NULL);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.labelledCueRegion.pString, pMetadata->data.labelledCueRegion.stringLength);
                        bytesWritten += ma_dr_wav__write_or_count_byte(pWav, '\0');
                    }
                } break;
                case ma_dr_wav_metadata_type_unknown:
                {
                    if (pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_adtl_list) {
                        subchunkSize = pMetadata->data.unknown.dataSizeInBytes;
                        MA_DR_WAV_ASSERT(pMetadata->data.unknown.pData != NULL);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.id, 4);
                        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.pData, subchunkSize);
                    }
                } break;
                default: break;
            }
            if ((subchunkSize % 2) != 0) {
                bytesWritten += ma_dr_wav__write_or_count_byte(pWav, 0);
            }
        }
    }
    MA_DR_WAV_ASSERT((bytesWritten % 2) == 0);
    return bytesWritten;
}